

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void htmlstartElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  xmlChar **ppxVar1;
  size_t sVar2;
  long lVar3;
  uchar *att;
  xmlChar *__s;
  int attlen;
  int outlen;
  xmlChar **local_60;
  uchar output [40];
  
  fprintf((FILE *)SAXdebug,"SAX.startElement(%s",name);
  if (atts != (xmlChar **)0x0) {
    local_60 = atts;
    for (lVar3 = 0; ppxVar1 = local_60, local_60[lVar3] != (xmlChar *)0x0; lVar3 = lVar3 + 2) {
      fprintf((FILE *)SAXdebug,", %s");
      __s = ppxVar1[lVar3 + 1];
      if (__s != (xmlChar *)0x0) {
        fwrite("=\'",2,1,(FILE *)SAXdebug);
        while( true ) {
          sVar2 = strlen((char *)__s);
          attlen = (int)sVar2;
          if (attlen < 1) break;
          outlen = 0x27;
          htmlEncodeEntities(output,&outlen,__s,&attlen,0x27);
          output[outlen] = '\0';
          fputs((char *)output,(FILE *)SAXdebug);
          __s = __s + attlen;
        }
        fputc(0x27,(FILE *)SAXdebug);
      }
    }
  }
  fwrite(")\n",2,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
htmlstartElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    fprintf(SAXdebug, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(SAXdebug, ", %s", atts[i++]);
	    if (atts[i] != NULL) {
		unsigned char output[40];
		const unsigned char *att = atts[i];
		int outlen, attlen;
	        fprintf(SAXdebug, "='");
		while ((attlen = strlen((char*)att)) > 0) {
		    outlen = sizeof output - 1;
		    htmlEncodeEntities(output, &outlen, att, &attlen, '\'');
		    output[outlen] = 0;
		    fprintf(SAXdebug, "%s", (char *) output);
		    att += attlen;
		}
		fprintf(SAXdebug, "'");
	    }
	}
    }
    fprintf(SAXdebug, ")\n");
}